

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O0

void __thiscall
KokkosTools::SpaceTimeStack::StackNode::print_recursive
          (StackNode *this,ostream *os,string *my_indent,string *child_indent,double tree_time)

{
  double dVar1;
  double dVar2;
  long lVar3;
  StackNode *this_00;
  bool bVar4;
  _Setprecision _Var5;
  ulong uVar6;
  ostream *poVar7;
  reference pSVar8;
  reference ppSVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  StackNode *local_190;
  StackNode *child_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  string grandchild_indent;
  _Self local_120;
  iterator it;
  iterator last;
  reference local_100;
  reference local_f8;
  StackNode *child_1;
  iterator __end2;
  iterator __begin2;
  set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
  *__range2;
  allocator<const_KokkosTools::SpaceTimeStack::StackNode_*> local_c1;
  undefined1 local_c0 [8];
  set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
  children_by_time;
  anon_class_1_0_00000001_for__M_key_compare by_time;
  double kps;
  double remainder;
  StackNode *child;
  iterator __end4;
  iterator __begin4;
  set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
  *__range4;
  double child_runtime;
  double percent_kokkos;
  double imbalance;
  double percent;
  double tree_time_local;
  string *child_indent_local;
  string *my_indent_local;
  ostream *os_local;
  StackNode *this_local;
  
  dVar10 = (this->total_runtime / tree_time) * 100.0;
  if (output_threshold <= dVar10) {
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::operator<<(os,(string *)my_indent);
      dVar11 = (this->max_runtime / this->avg_runtime - 1.0) * 100.0;
      poVar7 = (ostream *)std::ostream::operator<<(os,std::scientific);
      _Var5 = std::setprecision(2);
      std::operator<<(poVar7,_Var5);
      poVar7 = (ostream *)std::ostream::operator<<(os,this->avg_runtime);
      std::operator<<(poVar7," sec ");
      poVar7 = (ostream *)std::ostream::operator<<(os,std::fixed);
      _Var5 = std::setprecision(1);
      std::operator<<(poVar7,_Var5);
      dVar12 = (this->total_kokkos_runtime / this->total_runtime) * 100.0;
      if (this->kind == STACK_REGION) {
        __range4 = (set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
                    *)0x0;
        __end4 = std::
                 set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
                 ::begin(&this->children);
        child = (StackNode *)
                std::
                set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
                ::end(&this->children);
        while (bVar4 = std::operator!=(&__end4,(_Self *)&child), bVar4) {
          pSVar8 = std::_Rb_tree_const_iterator<KokkosTools::SpaceTimeStack::StackNode>::operator*
                             (&__end4);
          __range4 = (set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
                      *)(pSVar8->total_runtime + (double)__range4);
          std::_Rb_tree_const_iterator<KokkosTools::SpaceTimeStack::StackNode>::operator++(&__end4);
        }
        dVar1 = this->total_runtime;
        lVar3 = this->total_number_of_kernel_calls;
        dVar2 = this->avg_runtime;
        poVar7 = (ostream *)std::ostream::operator<<(os,dVar10);
        poVar7 = std::operator<<(poVar7,"% ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar12);
        poVar7 = std::operator<<(poVar7,"% ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar11);
        poVar7 = std::operator<<(poVar7,"% ");
        poVar7 = (ostream *)
                 std::ostream::operator<<(poVar7,(1.0 - (double)__range4 / dVar1) * 100.0);
        poVar7 = std::operator<<(poVar7,"% ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::scientific);
        children_by_time._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             std::setprecision(2);
        poVar7 = std::operator<<(poVar7,children_by_time._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count._4_4_);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(double)lVar3 / dVar2);
        poVar7 = std::operator<<(poVar7," ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->number_of_calls);
        poVar7 = std::operator<<(poVar7," ");
        std::operator<<(poVar7,(string *)&this->name);
      }
      else {
        poVar7 = (ostream *)std::ostream::operator<<(os,dVar10);
        poVar7 = std::operator<<(poVar7,"% ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar12);
        poVar7 = std::operator<<(poVar7,"% ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar11);
        poVar7 = std::operator<<(poVar7,"% ");
        poVar7 = std::operator<<(poVar7,"------ ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->number_of_calls);
        poVar7 = std::operator<<(poVar7," ");
        std::operator<<(poVar7,(string *)&this->name);
      }
      switch(this->kind) {
      case STACK_FOR:
        std::operator<<(os," [for]");
        break;
      case STACK_REDUCE:
        std::operator<<(os," [reduce]");
        break;
      case STACK_SCAN:
        std::operator<<(os," [scan]");
        break;
      case STACK_REGION:
        std::operator<<(os," [region]");
        break;
      case STACK_COPY:
        std::operator<<(os," [copy]");
      }
      std::operator<<(os,'\n');
    }
    bVar4 = std::
            set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
            ::empty(&this->children);
    if (!bVar4) {
      std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>::allocator(&local_c1);
      std::
      set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
      ::set((set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
             *)local_c0,
            (anon_class_1_0_00000001_for__M_key_compare *)
            ((long)&children_by_time._M_t._M_impl.super__Rb_tree_header._M_node_count + 3),&local_c1
           );
      std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>::~allocator(&local_c1);
      __end2 = std::
               set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
               ::begin(&this->children);
      child_1 = (StackNode *)
                std::
                set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
                ::end(&this->children);
      while (bVar4 = std::operator!=(&__end2,(_Self *)&child_1), bVar4) {
        local_100 = std::_Rb_tree_const_iterator<KokkosTools::SpaceTimeStack::StackNode>::operator*
                              (&__end2);
        local_f8 = local_100;
        std::
        set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
        ::insert((set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
                  *)local_c0,&local_100);
        std::_Rb_tree_const_iterator<KokkosTools::SpaceTimeStack::StackNode>::operator++(&__end2);
      }
      it = std::
           set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
           ::end((set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
                  *)local_c0);
      std::_Rb_tree_const_iterator<const_KokkosTools::SpaceTimeStack::StackNode_*>::operator--(&it);
      local_120._M_node =
           (_Base_ptr)
           std::
           set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
           ::begin((set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
                    *)local_c0);
      while( true ) {
        grandchild_indent.field_2._8_8_ =
             std::
             set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
             ::end((set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
                    *)local_c0);
        bVar4 = std::operator!=(&local_120,(_Self *)((long)&grandchild_indent.field_2 + 8));
        if (!bVar4) break;
        std::__cxx11::string::string((string *)local_148);
        bVar4 = std::operator==(&local_120,&it);
        if (bVar4) {
          std::operator+(&local_168,child_indent,"    ");
          std::__cxx11::string::operator=((string *)local_148,(string *)&local_168);
          std::__cxx11::string::~string((string *)&local_168);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &child_2,child_indent,"|   ");
          std::__cxx11::string::operator=((string *)local_148,(string *)&child_2);
          std::__cxx11::string::~string((string *)&child_2);
        }
        ppSVar9 = std::_Rb_tree_const_iterator<const_KokkosTools::SpaceTimeStack::StackNode_*>::
                  operator*(&local_120);
        this_00 = *ppSVar9;
        local_190 = this_00;
        std::operator+(&local_1b0,child_indent,"|-> ");
        print_recursive(this_00,os,&local_1b0,(string *)local_148,tree_time);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)local_148);
        std::_Rb_tree_const_iterator<const_KokkosTools::SpaceTimeStack::StackNode_*>::operator++
                  (&local_120);
      }
      std::
      set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
      ::~set((set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
              *)local_c0);
    }
  }
  return;
}

Assistant:

void print_recursive(std::ostream& os, std::string my_indent,
                       std::string const& child_indent,
                       double tree_time) const {
    auto percent = (total_runtime / tree_time) * 100.0;

    if (percent < output_threshold) return;
    if (!name.empty()) {
      os << my_indent;
      auto imbalance = (max_runtime / avg_runtime - 1.0) * 100.0;
      os << std::scientific << std::setprecision(2);
      os << avg_runtime << " sec ";
      os << std::fixed << std::setprecision(1);
      auto percent_kokkos = (total_kokkos_runtime / total_runtime) * 100.0;

      // Sum over kids if we're a region
      if (kind == STACK_REGION) {
        double child_runtime = 0.0;
        for (auto& child : children) {
          child_runtime += child.total_runtime;
        }
        auto remainder = (1.0 - child_runtime / total_runtime) * 100.0;
        double kps     = total_number_of_kernel_calls / avg_runtime;
        os << percent << "% " << percent_kokkos << "% " << imbalance << "% "
           << remainder << "% " << std::scientific << std::setprecision(2)
           << kps << " " << number_of_calls << " " << name;
      } else
        os << percent << "% " << percent_kokkos << "% " << imbalance << "% "
           << "------ " << number_of_calls << " " << name;

      switch (kind) {
        case STACK_FOR: os << " [for]"; break;
        case STACK_REDUCE: os << " [reduce]"; break;
        case STACK_SCAN: os << " [scan]"; break;
        case STACK_REGION: os << " [region]"; break;
        case STACK_COPY: os << " [copy]"; break;
      };

      os << '\n';
    }
    if (children.empty()) return;
    auto by_time = [](StackNode const* a, StackNode const* b) {
      if (a->total_runtime != b->total_runtime) {
        return a->total_runtime > b->total_runtime;
      }
      return a->name < b->name;
    };
    std::set<StackNode const*, decltype(by_time)> children_by_time(by_time);
    for (auto& child : children) {
      children_by_time.insert(&child);
    }
    auto last = children_by_time.end();
    --last;
    for (auto it = children_by_time.begin(); it != children_by_time.end();
         ++it) {
      std::string grandchild_indent;
      if (it == last) {
        grandchild_indent = child_indent + "    ";
      } else {
        grandchild_indent = child_indent + "|   ";
      }
      auto child = *it;
      child->print_recursive(os, child_indent + "|-> ", grandchild_indent,
                             tree_time);
    }
  }